

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

size_t fctkern__chk_cnt(fctkern_t *nk)

{
  size_t sVar1;
  size_t sVar2;
  void *pvVar3;
  void *pvVar4;
  long lVar5;
  size_t idx;
  size_t idx_00;
  size_t sVar6;
  
  if (nk == (fctkern_t *)0x0) {
    __assert_fail("nk != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x902
                  ,"size_t fctkern__chk_cnt(const fctkern_t *)");
  }
  sVar1 = (nk->ts_list).used_itm_num;
  idx = 0;
  sVar6 = 0;
  while( true ) {
    if (idx == sVar1) {
      return sVar6;
    }
    pvVar3 = fct_nlist__at(&nk->ts_list,idx);
    if (pvVar3 == (void *)0x0) break;
    sVar2 = *(size_t *)((long)pvVar3 + 0x120);
    lVar5 = 0;
    for (idx_00 = 0; sVar2 != idx_00; idx_00 = idx_00 + 1) {
      pvVar4 = fct_nlist__at((fct_nlist_t *)((long)pvVar3 + 0x110),idx_00);
      if (pvVar4 == (void *)0x0) {
        __assert_fail("test != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x41b,"size_t fct_test__chk_cnt(const fct_test_t *)");
      }
      lVar5 = lVar5 + *(long *)((long)pvVar4 + 0x10) + *(long *)((long)pvVar4 + 0x28);
    }
    sVar6 = sVar6 + lVar5;
    idx = idx + 1;
  }
  __assert_fail("ts != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x53f,
                "size_t fct_ts__chk_cnt(const fct_ts_t *)");
}

Assistant:

static size_t
fctkern__chk_cnt(fctkern_t const *nk)
{
    size_t tally =0;
    FCT_ASSERT( nk != NULL );

    FCT_NLIST_FOREACH_BGN(fct_ts_t *, ts, &(nk->ts_list))
    {
        tally += fct_ts__chk_cnt(ts);
    }
    FCT_NLIST_FOREACH_END();
    return tally;
}